

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O1

Kit_DsdNtk_t * Kit_DsdShrink(Kit_DsdNtk_t *p,int *pPrios)

{
  ushort uVar1;
  unsigned_short uVar2;
  int iVar3;
  Kit_DsdNtk_t *pNew;
  Kit_DsdObj_t *pKVar4;
  uint uVar5;
  
  if (0x10 < p->nVars) {
    __assert_fail("p->nVars <= 16",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                  ,0x666,"Kit_DsdNtk_t *Kit_DsdShrink(Kit_DsdNtk_t *, int *)");
  }
  pNew = Kit_DsdNtkAlloc((uint)p->nVars);
  uVar5 = (uint)(p->Root >> 1);
  uVar1 = p->nVars;
  if ((uint)p->nNodes + (uint)uVar1 <= uVar5) {
LAB_00553e7f:
    __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kit.h"
                  ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
  }
  if (((uint)*p->pNodes[(ulong)uVar5 - (ulong)uVar1] & 0x1c0) == 0x40) {
    pKVar4 = Kit_DsdObjAlloc(pNew,KIT_DSD_CONST1,0);
  }
  else {
    if (((uint)*p->pNodes[(ulong)uVar5 - (ulong)uVar1] & 0x1c0) != 0x80) {
      iVar3 = Kit_DsdShrink_rec(pNew,p,(uint)p->Root,pPrios);
      uVar2 = (unsigned_short)iVar3;
      goto LAB_00553e72;
    }
    pKVar4 = Kit_DsdObjAlloc(pNew,KIT_DSD_VAR,1);
    uVar5 = (uint)(p->Root >> 1);
    if ((uint)p->nNodes + (uint)p->nVars <= uVar5) goto LAB_00553e7f;
    *(undefined2 *)(pKVar4 + 1) = *(undefined2 *)(p->pNodes[(ulong)uVar5 - (ulong)p->nVars] + 1);
  }
  uVar2 = (p->Root & 1) + (SUB42(*pKVar4,0) & 0x3f) * 2;
LAB_00553e72:
  pNew->Root = uVar2;
  return pNew;
}

Assistant:

Kit_DsdNtk_t * Kit_DsdShrink( Kit_DsdNtk_t * p, int pPrios[] )
{
    Kit_DsdNtk_t * pNew;
    Kit_DsdObj_t * pObjNew;
    assert( p->nVars <= 16 );
    // create a new network
    pNew = Kit_DsdNtkAlloc( p->nVars );
    // consider simple special cases
    if ( Kit_DsdNtkRoot(p)->Type == KIT_DSD_CONST1 )
    {
        pObjNew = Kit_DsdObjAlloc( pNew, KIT_DSD_CONST1, 0 );
        pNew->Root = Abc_Var2Lit( pObjNew->Id, Abc_LitIsCompl(p->Root) );
        return pNew;
    }
    if ( Kit_DsdNtkRoot(p)->Type == KIT_DSD_VAR )
    {
        pObjNew = Kit_DsdObjAlloc( pNew, KIT_DSD_VAR, 1 );
        pObjNew->pFans[0] = Kit_DsdNtkRoot(p)->pFans[0];
        pNew->Root = Abc_Var2Lit( pObjNew->Id, Abc_LitIsCompl(p->Root) );
        return pNew;
    }
    // convert the root node
    pNew->Root = Kit_DsdShrink_rec( pNew, p, p->Root, pPrios );
    return pNew;
}